

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O3

void __thiscall proto2_unittest::TestHugeFieldNumbersLite::Clear(TestHugeFieldNumbersLite *this)

{
  RepeatedField<int> *pRVar1;
  uint uVar2;
  ulong uVar3;
  ForeignMessageLite *this_00;
  TestHugeFieldNumbersLite_OptionalGroup *this_01;
  int iVar4;
  undefined8 *puVar5;
  char *failure_msg;
  char *file;
  bool bVar6;
  LogMessageFatal local_30;
  
  google::protobuf::internal::ExtensionSet::Clear(&(this->field_0)._impl_._extensions_);
  pRVar1 = &(this->field_0)._impl_.repeated_int32_;
  uVar3 = *(ulong *)((long)&this->field_0 + 0x20);
  if ((uVar3 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar6 = (uVar3 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar6);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar6);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar3 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.packed_int32_;
  uVar3 = *(ulong *)((long)&this->field_0 + 0x30);
  if ((uVar3 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar6 = (uVar3 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar6);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar6);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar3 & 4) == 0,0);
  if (*(int *)((long)&this->field_0 + 0x4c) != 1) {
    google::protobuf::internal::UntypedMapBase::ClearTableImpl
              ((UntypedMapBase *)&(this->field_0)._impl_.string_string_map_,true);
  }
  uVar2 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar2 & 0xf) == 0) goto LAB_001e2f7a;
  if ((uVar2 & 1) != 0) {
    uVar3 = *(ulong *)((long)&this->field_0 + 0x68);
    if ((uVar3 & 3) != 0) {
      puVar5 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
      puVar5[1] = 0;
      *(undefined1 *)*puVar5 = 0;
      goto LAB_001e2f1d;
    }
LAB_001e2fcb:
    file = 
    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring.h"
    ;
    failure_msg = "!tagged_ptr_.IsDefault()";
    iVar4 = 0x20b;
LAB_001e3020:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_30,file,iVar4,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
  }
LAB_001e2f1d:
  if ((uVar2 & 2) != 0) {
    uVar3 = *(ulong *)((long)&this->field_0 + 0x70);
    if ((uVar3 & 3) == 0) goto LAB_001e2fcb;
    puVar5 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
    puVar5[1] = 0;
    *(undefined1 *)*puVar5 = 0;
  }
  if ((uVar2 & 4) != 0) {
    this_00 = (this->field_0)._impl_.optional_message_;
    if (this_00 == (ForeignMessageLite *)0x0) {
      file = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest_lite.pb.cc"
      ;
      failure_msg = "_impl_.optional_message_ != nullptr";
      iVar4 = 0x29e7;
      goto LAB_001e3020;
    }
    ForeignMessageLite::Clear(this_00);
  }
  if ((uVar2 & 8) != 0) {
    this_01 = (this->field_0)._impl_.optionalgroup_;
    if (this_01 == (TestHugeFieldNumbersLite_OptionalGroup *)0x0) {
      file = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest_lite.pb.cc"
      ;
      failure_msg = "_impl_.optionalgroup_ != nullptr";
      iVar4 = 0x29eb;
      goto LAB_001e3020;
    }
    TestHugeFieldNumbersLite_OptionalGroup::Clear(this_01);
  }
LAB_001e2f7a:
  if ((uVar2 & 0x70) != 0) {
    *(undefined8 *)((long)&this->field_0 + 0x88) = 0;
    (this->field_0)._impl_.optional_enum_ = 4;
  }
  clear_oneof_field(this);
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestHugeFieldNumbersLite::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestHugeFieldNumbersLite)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_._extensions_.Clear();
  _impl_.repeated_int32_.Clear();
  _impl_.packed_int32_.Clear();
  _impl_.string_string_map_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.optional_string_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _impl_.optional_bytes_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(_impl_.optional_message_ != nullptr);
      _impl_.optional_message_->Clear();
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(_impl_.optionalgroup_ != nullptr);
      _impl_.optionalgroup_->Clear();
    }
  }
  if ((cached_has_bits & 0x00000070u) != 0) {
    ::memset(&_impl_.optional_int32_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.fixed_32_) -
        reinterpret_cast<char*>(&_impl_.optional_int32_)) + sizeof(_impl_.fixed_32_));
    _impl_.optional_enum_ = 4;
  }
  clear_oneof_field();
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<std::string>();
}